

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Quoted_String_(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                 *this)

{
  Position *this_00;
  byte bVar1;
  char *pcVar2;
  eval_error *this_01;
  char *pcVar3;
  int iVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  string local_58;
  File_Position local_38;
  
  pcVar2 = (this->m_position).m_pos;
  pcVar3 = (this->m_position).m_end;
  if ((pcVar2 == pcVar3) || (*pcVar2 != '\"')) {
    return false;
  }
  this_00 = &this->m_position;
  if (pcVar2 == pcVar3) {
    pcVar2 = "";
  }
  cVar5 = *pcVar2;
  Position::operator++(this_00);
  pcVar2 = (this->m_position).m_pos;
  bVar6 = pcVar2 == (this->m_position).m_end;
  if (!bVar6) {
    bVar7 = cVar5 == '\\';
    if ((*pcVar2 != '\"') || (cVar5 == '\\')) {
      iVar4 = 0;
      bVar1 = 0;
      do {
        bVar6 = Eol_(this,false);
        if (!bVar6) {
          if (cVar5 == '\\') {
LAB_004a7e15:
            pcVar2 = (this->m_position).m_pos;
            pcVar3 = "";
            if (pcVar2 != (this->m_position).m_end) {
              pcVar3 = pcVar2;
            }
            if (*pcVar3 == '}') {
              iVar4 = iVar4 - (uint)(~bVar1 & 1);
            }
          }
          else if (cVar5 == '$') {
            pcVar2 = (this->m_position).m_pos;
            pcVar3 = "";
            if (pcVar2 != (this->m_position).m_end) {
              pcVar3 = pcVar2;
            }
            if (*pcVar3 != '{') {
              if (bVar7) goto LAB_004a7e15;
              goto LAB_004a7df4;
            }
            iVar4 = iVar4 + 1;
          }
          else {
LAB_004a7df4:
            pcVar2 = (this->m_position).m_pos;
            pcVar3 = "";
            if (pcVar2 != (this->m_position).m_end) {
              pcVar3 = pcVar2;
            }
            if (*pcVar3 != '\"') goto LAB_004a7e15;
            bVar1 = bVar1 ^ 1;
          }
          if (bVar7) {
            cVar5 = '\0';
          }
          else {
            pcVar2 = (this->m_position).m_pos;
            pcVar3 = "";
            if (pcVar2 != (this->m_position).m_end) {
              pcVar3 = pcVar2;
            }
            cVar5 = *pcVar3;
          }
          Position::operator++(this_00);
        }
        pcVar2 = (this->m_position).m_pos;
        bVar6 = pcVar2 == (this->m_position).m_end;
        if (bVar6) goto LAB_004a7eae;
        bVar7 = cVar5 == '\\';
      } while (((*pcVar2 != '\"') || (0 < iVar4)) || (cVar5 == '\\'));
    }
    if (!bVar6) {
      Position::operator++(this_00);
      return true;
    }
  }
LAB_004a7eae:
  this_01 = (eval_error *)__cxa_allocate_exception(0x90);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unclosed quoted string","");
  local_38.line = (this->m_position).line;
  local_38.column = (this->m_position).col;
  exception::eval_error::eval_error
            (this_01,&local_58,&local_38,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_01,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }